

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::dataLink(CommonCore *this,string_view source,string_view target)

{
  ActionMessage link;
  ActionMessage AStack_e8;
  
  ActionMessage::ActionMessage(&AStack_e8,cmd_data_link);
  ActionMessage::name(&AStack_e8,source);
  ActionMessage::setStringData(&AStack_e8,target);
  BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_e8);
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CommonCore::dataLink(std::string_view source, std::string_view target)
{
    ActionMessage link(CMD_DATA_LINK);
    link.name(source);
    link.setStringData(target);
    addActionMessage(std::move(link));
}